

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

object __thiscall pybind11::cpp_function::name(cpp_function *this)

{
  handle in_RDI;
  accessor<pybind11::detail::accessor_policies::str_attr> *this_00;
  char *in_stack_ffffffffffffffc0;
  object_api<pybind11::handle> *in_stack_ffffffffffffffc8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_30;
  
  this_00 = &local_30;
  detail::object_api<pybind11::handle>::attr(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  detail::accessor::operator_cast_to_object(this_00);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x16da40);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object name() const { return attr("__name__"); }